

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O3

bool __thiscall
FlowGraph::RemoveUnreachableBlock(FlowGraph *this,BasicBlock *block,GlobOpt *globOpt)

{
  BasicBlock *pBVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  undefined4 *puVar5;
  Type *ppFVar6;
  Loop *currentLoop;
  Loop *pLVar7;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar8;
  Iterator local_40;
  
  pSVar8 = &(block->predList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
  if (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
       (block->predList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
       super_SListNodeBase<Memory::ArenaAllocator>.next == pSVar8) &&
     (this->func->m_fg->blockList != block)) {
LAB_0041901d:
    RemoveBlock(this,block,globOpt,false);
    bVar4 = true;
  }
  else {
    if ((block->field_0x18 & 4) != 0) {
      bVar4 = true;
      local_40.list = pSVar8;
      local_40.current = &pSVar8->super_SListNodeBase<Memory::ArenaAllocator>;
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      while( true ) {
        if (pSVar8 == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar3) goto LAB_00419038;
          *puVar5 = 0;
          pSVar8 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current;
        }
        pSVar8 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                 (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                  &pSVar8->super_SListNodeBase<Memory::ArenaAllocator>)->
                 super_SListNodeBase<Memory::ArenaAllocator>).next;
        if (pSVar8 == local_40.list) break;
        local_40.current = (NodeBase *)pSVar8;
        ppFVar6 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                            (&local_40);
        pBVar1 = (*ppFVar6)->predBlock;
        if (pBVar1 == (BasicBlock *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                             ,0x98c,"(pred)","pred");
          if (!bVar3) {
LAB_00419038:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar5 = 0;
        }
        pLVar7 = pBVar1->loop;
        bVar3 = pLVar7 != (Loop *)0x0;
        if (pLVar7 != block->loop && bVar3) {
          do {
            pLVar7 = pLVar7->parent;
            bVar3 = pLVar7 != (Loop *)0x0;
            if (pLVar7 == block->loop) break;
          } while (pLVar7 != (Loop *)0x0);
        }
        bVar4 = (bool)(bVar4 & bVar3);
        pSVar8 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current;
      }
      if (bVar4) goto LAB_0041901d;
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool
FlowGraph::RemoveUnreachableBlock(BasicBlock *block, GlobOpt * globOpt)
{
    bool isDead = false;

    if ((block->GetPredList() == nullptr || block->GetPredList()->Empty()) && block != this->func->m_fg->blockList)
    {
        isDead = true;
    }
    else if (block->isLoopHeader)
    {
        // A dead loop still has back-edges pointing to it...
        isDead = true;
        FOREACH_PREDECESSOR_BLOCK(pred, block)
        {
            if (!block->loop->IsDescendentOrSelf(pred->loop))
            {
                isDead = false;
            }
        } NEXT_PREDECESSOR_BLOCK;
    }

    if (isDead)
    {
        this->RemoveBlock(block, globOpt);
        return true;
    }
    return false;
}